

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecPeformDec_rec
              (Sfm_Dec_t *p,word *pTruth,int *pSupp,int *pAssump,int nAssump,word (*Masks) [8],
              int fCofactor,int nSuppAdd)

{
  int *piVar1;
  ulong *puVar2;
  word *pwVar3;
  Sfm_Par_t *pSVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  Vec_Int_t *pVVar7;
  Vec_Wrd_t *pVVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  word (*pTruth_00) [4];
  timespec *ptVar12;
  uint uVar13;
  long lVar14;
  int (*paiVar15) [16];
  undefined8 uVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  char *pcVar20;
  long lVar21;
  uint *puVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int *local_218;
  int local_200;
  int local_1fc;
  uint *local_1f8;
  ulong local_1f0;
  int (*local_1e8) [16];
  ulong local_1e0;
  ulong local_1d8;
  Vec_Int_t *local_1d0;
  long local_1c8;
  int (*local_1c0) [16];
  uint local_1b4;
  long local_1b0;
  long local_1a8;
  Vec_Wrd_t *local_1a0;
  long local_198;
  int *local_190;
  ulong local_188;
  long local_180;
  timespec ts;
  timespec local_138 [4];
  word uTruth [2] [4];
  int Supp [2] [16];
  
  local_1f8 = (uint *)pSupp;
  if (8 < nAssump) {
    __assert_fail("nAssump <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x32f,
                  "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                 );
  }
  local_1c8 = (long)p->pPars->nBTLimit;
  local_1b0 = (long)nAssump;
  local_1e8 = (int (*) [16])p->pDivWords[local_1b0];
  if (p->pPars->fVeryVerbose != 0) {
    printf("\nObject %d\n",(ulong)(uint)p->iTarget);
    printf("Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ",(double)p->AreaMffc * 0.001,
           (ulong)(uint)p->nDivs,(ulong)(uint)(p->vObjGates).nSize,(ulong)(uint)p->nMffc);
    printf("Pat0 = %d.  Pat1 = %d.    ",(ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
    putchar(10);
    if (nAssump != 0) {
      printf("Cofactor: ");
      if (0 < nAssump) {
        uVar24 = 0;
        do {
          uVar11 = pAssump[uVar24];
          if ((int)uVar11 < 0) goto LAB_004b8042;
          pcVar20 = "!";
          if ((uVar11 & 1) == 0) {
            pcVar20 = "";
          }
          printf(" %s%d",pcVar20,(ulong)(uVar11 >> 1));
          uVar24 = uVar24 + 1;
        } while ((uint)nAssump != uVar24);
      }
      putchar(10);
    }
  }
  local_1d8 = (ulong)(uint)nSuppAdd;
  local_1e0 = (ulong)(uint)fCofactor;
  piVar1 = pAssump + local_1b0;
  puVar22 = (uint *)(pAssump + local_1b0 + 1);
  uVar24 = 0;
  bVar26 = true;
  do {
    bVar18 = bVar26;
    if (0 < (long)p->nPatWords[uVar24]) {
      lVar14 = 0;
      do {
        if (Masks[uVar24][lVar14] != 0) goto LAB_004b6f52;
        lVar14 = lVar14 + 1;
      } while (p->nPatWords[uVar24] != lVar14);
    }
    p->nSatCalls = p->nSatCalls + 1;
    if (p->iTarget < 0) goto LAB_004b8004;
    *piVar1 = (int)uVar24 + p->iTarget * 2;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar14 = 1;
    }
    else {
      lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    iVar9 = sat_solver_solve(p->pSat,pAssump,(lit *)puVar22,local_1c8,0,0,0);
    if (iVar9 != 1) {
      if (iVar9 == -1) {
        p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeSatUnsat = p->timeSatUnsat + lVar17 + lVar14;
        auVar6 = _DAT_007ee2e0;
        pSVar4 = p->pPars;
        iVar9 = pSVar4->nVarMax;
        uVar25 = (ulong)(uint)(1 << ((char)iVar9 - 6U & 0x1f));
        if (iVar9 < 7) {
          uVar25 = 1;
        }
        if (0 < (int)uVar25) {
          lVar14 = (long)-(int)uVar24;
          lVar17 = uVar25 - 1;
          auVar27._8_4_ = (int)lVar17;
          auVar27._0_8_ = lVar17;
          auVar27._12_4_ = (int)((ulong)lVar17 >> 0x20);
          lVar17 = 0;
          auVar27 = auVar27 ^ _DAT_007ee2e0;
          auVar30 = _DAT_007ee2d0;
          do {
            auVar32 = auVar30 ^ auVar6;
            if ((bool)(~(auVar32._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar32._0_4_ ||
                        auVar27._4_4_ < auVar32._4_4_) & 1)) {
              *(long *)((long)pTruth + lVar17) = lVar14;
            }
            if ((auVar32._12_4_ != auVar27._12_4_ || auVar32._8_4_ <= auVar27._8_4_) &&
                auVar32._12_4_ <= auVar27._12_4_) {
              *(long *)((long)pTruth + lVar17 + 8) = lVar14;
            }
            lVar21 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 2;
            auVar30._8_8_ = lVar21 + 2;
            lVar17 = lVar17 + 0x10;
          } while ((ulong)((int)uVar25 + 1U >> 1) << 4 != lVar17);
        }
        if (pSVar4->fVeryVerbose == 0) {
          return 0;
        }
        pcVar20 = "Found constant %d.\n";
        uVar23 = 0;
        goto LAB_004b7858;
      }
      if (iVar9 != 0) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x355,
                      "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                     );
      }
      goto LAB_004b7871;
    }
    p->nSatCallsSat = p->nSatCallsSat + 1;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeSatSat = p->timeSatSat + lVar17 + lVar14;
    iVar9 = p->nPats[uVar24];
    if (iVar9 == 0x200) {
      p->nSatCallsOver = p->nSatCallsOver + 1;
    }
    else {
      if (0 < p->nDivs) {
        lVar14 = 0;
        lVar17 = 0;
        do {
          iVar9 = sat_solver_var_value(p->pSat,(int)lVar17);
          if (iVar9 != 0) {
            if (p->vSets[uVar24].nSize <= lVar14) goto LAB_004b7fe5;
            puVar2 = p->vSets[uVar24].pArray + (p->nPats[uVar24] >> 6) + lVar14;
            *puVar2 = *puVar2 | 1L << ((byte)p->nPats[uVar24] & 0x3f);
          }
          lVar17 = lVar17 + 1;
          lVar14 = lVar14 + 8;
        } while (lVar17 < p->nDivs);
        iVar9 = p->nPats[uVar24];
      }
      p->nPatWords[uVar24] = (iVar9 >> 6) + 1;
      p->nPats[uVar24] = iVar9 + 1;
      Masks[uVar24][iVar9 >> 6] = Masks[uVar24][iVar9 >> 6] | 1L << ((byte)iVar9 & 0x3f);
    }
LAB_004b6f52:
    uVar24 = 1;
    bVar26 = false;
  } while (bVar18);
  uVar24 = (ulong)(uint)p->iUseThis;
  if (p->iUseThis != 0xffffffff) {
    p->iUseThis = -1;
    goto LAB_004b6f86;
  }
  local_1d0 = p->vImpls;
  p->vImpls[0].nSize = 0;
  p->vImpls[1].nSize = 0;
  if (0 < p->nDivs) {
    local_190 = piVar1 + 2;
    local_1a8 = 0;
    lVar14 = 0;
    do {
      Supp[0][0] = -1;
      uTruth[0][0]._0_4_ = 0xffffffff;
      local_180 = lVar14 * 8;
      uVar11 = (int)lVar14 * 4;
      local_1f0 = (ulong)(uVar11 >> 6);
      local_188 = (ulong)(uVar11 & 0x3c);
      local_1b4 = (int)lVar14 * 2;
      paiVar15 = Supp;
      lVar17 = 0;
      local_198 = lVar14;
      bVar26 = true;
      do {
        bVar18 = bVar26;
        if (p->vSets[lVar17].nSize <= local_180) goto LAB_004b7fe5;
        local_1a0 = p->vSets + lVar17;
        lVar14 = (long)p->nPatWords[lVar17];
        uVar11 = 0;
        if (0 < lVar14) {
          lVar21 = 0;
          do {
            uVar24 = ~*(ulong *)((long)local_1a0->pArray + lVar21 * 8 + local_1a8) &
                     Masks[lVar17][lVar21];
            if (uVar24 != 0) break;
            bVar26 = lVar14 + -1 != lVar21;
            lVar21 = lVar21 + 1;
          } while (bVar26);
          lVar21 = 0;
          do {
            if ((*(ulong *)((long)local_1a0->pArray + lVar21 * 8 + local_1a8) &
                Masks[lVar17][lVar21]) != 0) {
              if (uVar24 != 0) goto LAB_004b75be;
              uVar11 = 1;
              break;
            }
            lVar21 = lVar21 + 1;
          } while (lVar14 != lVar21);
        }
        if (p->iTarget < 0) goto LAB_004b8004;
        *piVar1 = (int)lVar17 + p->iTarget * 2;
        piVar1[1] = uVar11 | local_1b4;
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar14 = 1;
        }
        else {
          lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        uVar11 = uVar11 | (int)local_188 + (int)lVar17 * 2;
        local_1c0 = paiVar15;
        if ((*(ulong *)(*local_1e8 + local_1f0 * 2) >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
          p->nSatCalls = p->nSatCalls + 1;
          iVar9 = sat_solver_solve(p->pSat,pAssump,local_190,local_1c8,0,0,0);
          if (iVar9 == -1) {
            iVar9 = p->nSatCallsUnsat + 1;
            goto LAB_004b7516;
          }
          if (iVar9 != 1) {
            if (iVar9 != 0) {
              __assert_fail("status == l_True",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x393,
                            "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                           );
            }
            goto LAB_004b7871;
          }
          p->nSatCallsSat = p->nSatCallsSat + 1;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          pVVar8 = local_1a0;
          if (iVar9 < 0) {
            lVar21 = -1;
          }
          else {
            lVar21 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeSatSat = p->timeSatSat + lVar21 + lVar14;
          iVar9 = p->nPats[lVar17];
          if (iVar9 == 0x200) {
            p->nSatCallsOver = p->nSatCallsOver + 1;
          }
          else {
            if (0 < p->nDivs) {
              lVar21 = 0;
              lVar14 = 0;
              do {
                iVar9 = sat_solver_var_value(p->pSat,(int)lVar14);
                if (iVar9 != 0) {
                  if (pVVar8->nSize <= lVar21) goto LAB_004b7fe5;
                  puVar2 = pVVar8->pArray + (p->nPats[lVar17] >> 6) + lVar21;
                  *puVar2 = *puVar2 | 1L << ((byte)p->nPats[lVar17] & 0x3f);
                }
                lVar14 = lVar14 + 1;
                lVar21 = lVar21 + 8;
              } while (lVar14 < p->nDivs);
              iVar9 = p->nPats[lVar17];
            }
            p->nPatWords[lVar17] = (iVar9 >> 6) + 1;
            p->nPats[lVar17] = iVar9 + 1;
            Masks[lVar17][iVar9 >> 6] = Masks[lVar17][iVar9 >> 6] | 1L << ((byte)iVar9 & 0x3f);
          }
        }
        else {
          iVar9 = p->nSatCallsUnsat;
LAB_004b7516:
          p->nSatCallsUnsat = iVar9;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar21 = -1;
          }
          else {
            lVar21 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeSatUnsat = p->timeSatUnsat + lVar21 + lVar14;
          if ((int)*puVar22 < 0) goto LAB_004b8023;
          uVar23 = *puVar22 ^ 1;
          (*local_1c0)[0] = uVar23;
          Vec_IntPush(local_1d0 + lVar17,uVar23);
          *(ulong *)(*local_1e8 + local_1f0 * 2) =
               *(ulong *)(*local_1e8 + local_1f0 * 2) | 1L << ((byte)uVar11 & 0x3f);
        }
LAB_004b75be:
        auVar6 = _DAT_007ee2e0;
        lVar17 = 1;
        paiVar15 = (int (*) [16])uTruth;
        bVar26 = false;
      } while (bVar18);
      if ((uint)uTruth[0][0] != 0xffffffff && Supp[0][0] != -1) {
        if (Supp[0][0] != (uint)uTruth[0][0]) {
          if ((Supp[0][0] < 0) || ((int)(uint)uTruth[0][0] < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10c,"int Abc_Lit2Var(int)");
          }
          if ((uint)Supp[0][0] >> 1 != (uint)uTruth[0][0] >> 1) {
            __assert_fail("Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x3aa,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          pSVar4 = p->pPars;
          iVar9 = pSVar4->nVarMax;
          uVar11 = 1 << ((char)iVar9 - 6U & 0x1f);
          if (iVar9 < 7) {
            uVar11 = 1;
          }
          if (0 < (int)uVar11) {
            uVar16 = 0x5555555555555555;
            if ((Supp[0][0] & 1U) == 0) {
              uVar16 = 0xaaaaaaaaaaaaaaaa;
            }
            lVar14 = (ulong)uVar11 - 1;
            auVar28._8_4_ = (int)lVar14;
            auVar28._0_8_ = lVar14;
            auVar28._12_4_ = (int)((ulong)lVar14 >> 0x20);
            lVar14 = 0;
            auVar28 = auVar28 ^ _DAT_007ee2e0;
            auVar32 = _DAT_007ee2d0;
            do {
              auVar31 = auVar32 ^ auVar6;
              if ((bool)(~(auVar31._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar31._0_4_ ||
                          auVar28._4_4_ < auVar31._4_4_) & 1)) {
                *(undefined8 *)((long)pTruth + lVar14) = uVar16;
              }
              if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
                  auVar31._12_4_ <= auVar28._12_4_) {
                *(undefined8 *)((long)pTruth + lVar14 + 8) = uVar16;
              }
              lVar17 = auVar32._8_8_;
              auVar32._0_8_ = auVar32._0_8_ + 2;
              auVar32._8_8_ = lVar17 + 2;
              lVar14 = lVar14 + 0x10;
            } while ((ulong)(uVar11 + 1 >> 1) << 4 != lVar14);
          }
          *local_1f8 = (uint)Supp[0][0] >> 1;
          if (pSVar4->fVeryVerbose == 0) {
            return 1;
          }
          pcVar20 = "!";
          if ((Supp[0][0] & 1U) == 0) {
            pcVar20 = "";
          }
          printf("Found variable %s%d.\n",pcVar20);
          return 1;
        }
        iVar9 = p->vImpls[0].nSize;
        if (iVar9 < 1) {
LAB_004b809f:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x396,"int Vec_IntPop(Vec_Int_t *)");
        }
        p->vImpls[0].nSize = iVar9 + -1;
        iVar9 = p->vImpls[1].nSize;
        if (iVar9 < 1) goto LAB_004b809f;
        p->vImpls[1].nSize = iVar9 + -1;
      }
      lVar14 = local_198 + 1;
      local_1a8 = local_1a8 + 0x40;
    } while (lVar14 < p->nDivs);
  }
  pSVar4 = p->pPars;
  if (pSVar4->nVarMax + -2 < nSuppAdd) {
    if (pSVar4->fVeryVerbose == 0) {
      return -2;
    }
    puts("The number of assumption is more than MFFC size.");
    return -2;
  }
  if (pSVar4->fUseAndOr != 0) {
    uVar24 = 0;
    bVar26 = true;
LAB_004b78a0:
    pVVar7 = local_1d0;
    uVar25 = uVar24 ^ 1;
    if (local_1d0[uVar25].nSize < 2) goto LAB_004b7b74;
    p->nSatCalls = p->nSatCalls + 1;
    if (p->iTarget < 0) {
LAB_004b8004:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    *piVar1 = (int)uVar24 + p->iTarget * 2;
    if (0x3dd < local_1d0[uVar25].nSize) {
      __assert_fail("Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                    ,0x3c0,
                    "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                   );
    }
    if (local_1d0[uVar25].nSize < 1) {
      lVar14 = 0;
    }
    else {
      piVar5 = local_1d0[uVar25].pArray;
      lVar14 = 0;
      do {
        puVar22[lVar14] = piVar5[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 < local_1d0[uVar25].nSize);
    }
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar17 = 1;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    iVar9 = sat_solver_solve(p->pSat,pAssump,(lit *)(puVar22 + lVar14),local_1c8,0,0,0);
    if (iVar9 == -1) {
      uVar11 = (p->pSat->conf_final).size;
      piVar5 = (p->pSat->conf_final).ptr;
      p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + lVar14 + lVar17;
      if ((int)(nSuppAdd + uVar11) < 7) {
        if ((int)uVar11 < 1) {
          uVar24 = (ulong)bVar26 - 1;
          *pTruth = uVar24;
          uVar23 = 0;
        }
        else {
          uVar24 = 0;
          uVar23 = 0;
          do {
            uVar13 = piVar5[uVar24];
            if ((int)uVar13 < 0) {
LAB_004b8023:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10e,"int Abc_LitNot(int)");
            }
            lVar14 = (long)pVVar7[uVar25].nSize;
            if (0 < lVar14) {
              uVar13 = uVar13 ^ 1;
              lVar17 = 0;
              do {
                if (pVVar7[uVar25].pArray[lVar17] == uVar13) {
                  lVar14 = (long)(int)uVar23;
                  uVar23 = uVar23 + 1;
                  local_1f8[lVar14] = uVar13;
                  break;
                }
                lVar17 = lVar17 + 1;
              } while (lVar14 != lVar17);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar11);
          if (6 < (int)uVar23) {
            __assert_fail("nFinal <= 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x3d7,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          if (bVar26 == false) {
            *pTruth = 0xffffffffffffffff;
            if ((int)uVar23 < 1) {
              uVar24 = 0xffffffffffffffff;
            }
            else {
              uVar24 = 0xffffffffffffffff;
              lVar14 = 0;
              puVar22 = local_1f8;
              do {
                uVar11 = *puVar22;
                if ((int)uVar11 < 0) goto LAB_004b8042;
                uVar24 = uVar24 & (-(ulong)(uVar11 & 1) ^ *(ulong *)((long)s_Truths6 + lVar14));
                *pTruth = uVar24;
                *puVar22 = uVar11 >> 1;
                lVar14 = lVar14 + 8;
                puVar22 = puVar22 + 1;
              } while ((ulong)uVar23 << 3 != lVar14);
            }
          }
          else {
            *pTruth = 0;
            if ((int)uVar23 < 1) {
              uVar24 = 0;
            }
            else {
              lVar14 = 0;
              uVar24 = 0;
              puVar22 = local_1f8;
              do {
                uVar11 = *puVar22;
                if ((int)uVar11 < 0) {
LAB_004b8042:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                ,0x10d,"int Abc_LitIsCompl(int)");
                }
                uVar24 = uVar24 | (ulong)(uVar11 & 1) - 1 ^ *(ulong *)((long)s_Truths6 + lVar14);
                *pTruth = uVar24;
                *puVar22 = uVar11 >> 1;
                lVar14 = lVar14 + 8;
                puVar22 = puVar22 + 1;
              } while ((ulong)uVar23 << 3 != lVar14);
            }
          }
        }
        auVar6 = _DAT_007ee2e0;
        pSVar4 = p->pPars;
        uVar11 = pSVar4->nVarMax;
        if (uVar23 != uVar11) {
          if ((int)uVar11 <= (int)uVar23) {
            __assert_fail("nVarS < nVarB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                          ,0x301,"void Abc_TtStretch6(word *, int, int)");
          }
          uVar13 = 1 << ((char)uVar11 - 6U & 0x1f);
          if (6 < (int)uVar11) {
            if ((int)uVar13 < 2) {
              __assert_fail("step < nWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x306,"void Abc_TtStretch6(word *, int, int)");
            }
            lVar14 = (ulong)uVar13 - 1;
            auVar29._8_4_ = (int)lVar14;
            auVar29._0_8_ = lVar14;
            auVar29._12_4_ = (int)((ulong)lVar14 >> 0x20);
            lVar14 = 0;
            auVar29 = auVar29 ^ _DAT_007ee2e0;
            auVar31 = _DAT_007ee2d0;
            do {
              auVar32 = auVar31 ^ auVar6;
              if ((bool)(~(auVar32._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar32._0_4_ ||
                          auVar29._4_4_ < auVar32._4_4_) & 1)) {
                *(ulong *)((long)pTruth + lVar14) = uVar24;
              }
              if ((auVar32._12_4_ != auVar29._12_4_ || auVar32._8_4_ <= auVar29._8_4_) &&
                  auVar32._12_4_ <= auVar29._12_4_) {
                *(ulong *)((long)pTruth + lVar14 + 8) = uVar24;
              }
              lVar17 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 2;
              auVar31._8_8_ = lVar17 + 2;
              lVar14 = lVar14 + 0x10;
            } while ((ulong)(uVar13 + 1 >> 1) << 4 != lVar14);
          }
        }
        p->nNodesAndOr = p->nNodesAndOr + 1;
        if (pSVar4->fVeryVerbose == 0) {
          return uVar23;
        }
        pcVar20 = "Found %d-input AND/OR gate.\n";
        uVar24 = (ulong)uVar23;
LAB_004b7858:
        printf(pcVar20,uVar24);
        return uVar23;
      }
      goto LAB_004b7b74;
    }
    if (iVar9 == 1) {
      p->nSatCallsSat = p->nSatCallsSat + 1;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      p->timeSatSat = p->timeSatSat + lVar14 + lVar17;
      iVar9 = p->nPats[uVar24];
      if (iVar9 == 0x200) {
        p->nSatCallsOver = p->nSatCallsOver + 1;
      }
      else {
        if (0 < p->nDivs) {
          lVar17 = 0;
          lVar14 = 0;
          do {
            iVar9 = sat_solver_var_value(p->pSat,(int)lVar14);
            if (iVar9 != 0) {
              if (p->vSets[uVar24].nSize <= lVar17) goto LAB_004b7fe5;
              puVar2 = p->vSets[uVar24].pArray + (p->nPats[uVar24] >> 6) + lVar17;
              *puVar2 = *puVar2 | 1L << ((byte)p->nPats[uVar24] & 0x3f);
            }
            lVar14 = lVar14 + 1;
            lVar17 = lVar17 + 8;
          } while (lVar14 < p->nDivs);
          iVar9 = p->nPats[uVar24];
        }
        p->nPatWords[uVar24] = (iVar9 >> 6) + 1;
        p->nPats[uVar24] = iVar9 + 1;
        Masks[uVar24][iVar9 >> 6] = Masks[uVar24][iVar9 >> 6] | 1L << ((byte)iVar9 & 0x3f);
      }
      goto LAB_004b7b74;
    }
    if (iVar9 != 0) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                    ,0x3f0,
                    "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                   );
    }
LAB_004b7871:
    p->nTimeOuts = p->nTimeOuts + 1;
    goto LAB_004b7877;
  }
LAB_004b7b89:
  uVar11 = Sfm_DecFindBestVar(p,Masks);
  uVar24 = (ulong)uVar11;
  if (fCofactor != 0 && uVar11 == 0xffffffff) {
    lVar14 = (long)(p->vObjInMffc).nSize;
    if (lVar14 < 1) {
      uVar24 = 0xffffffff;
LAB_004b7d48:
      local_1e0 = 0;
      if ((int)lVar14 != 0) goto LAB_004b7d64;
    }
    else {
      uVar11 = (p->vObjDec).nSize;
      do {
        uVar23 = (p->vObjInMffc).pArray[lVar14 + -1];
        uVar24 = (ulong)uVar23;
        if ((int)uVar11 < 1) goto LAB_004b7d48;
        uVar25 = 0;
        while ((p->vObjDec).pArray[uVar25] != uVar23) {
          uVar25 = uVar25 + 1;
          if (uVar11 == uVar25) goto LAB_004b7d48;
        }
        bVar26 = 1 < lVar14;
        lVar14 = lVar14 + -1;
      } while (bVar26);
    }
    local_1e0 = 0;
    uVar24 = 0xffffffff;
  }
LAB_004b7d64:
  if (p->pPars->fVeryVerbose != 0) {
    Sfm_DecPrint(p,Masks);
    printf("Best var %d\n",uVar24);
    putchar(10);
  }
LAB_004b6f86:
  iVar9 = (int)uVar24;
  if (iVar9 < 0) {
LAB_004b7877:
    iVar9 = -2;
  }
  else {
    uVar11 = 0;
    local_218 = &local_200;
    local_200 = 0;
    local_1fc = 0;
    Vec_IntPush(&p->vObjDec,iVar9);
    uVar23 = iVar9 * 8;
    local_1f0 = CONCAT44(local_1f0._4_4_,iVar9 * 2);
    local_1c0 = (int (*) [16])(long)(nAssump + 1);
    local_1d8 = (ulong)((int)local_1d8 + 1);
    pTruth_00 = uTruth;
    paiVar15 = Supp;
    bVar26 = true;
    do {
      bVar18 = bVar26;
      ptVar12 = &ts;
      lVar14 = 0;
      bVar26 = true;
      local_1e8 = paiVar15;
      do {
        bVar19 = bVar26;
        uVar13 = p->vSets[lVar14].nSize;
        if (uVar13 == uVar23 || SBORROW4(uVar13,uVar23) != (int)(uVar13 + iVar9 * -8) < 0) {
LAB_004b7fe5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar3 = p->vSets[lVar14].pArray;
        uVar13 = p->nPatWords[lVar14];
        if (bVar18) {
          if ((int)uVar13 < 1) goto LAB_004b7098;
          uVar24 = 0;
          do {
            (&ptVar12->tv_sec)[uVar24] = ~pwVar3[uVar23 + uVar24] & Masks[lVar14][uVar24];
            uVar24 = uVar24 + 1;
          } while (uVar13 != uVar24);
LAB_004b7093:
          if ((int)uVar13 < 8) goto LAB_004b7098;
        }
        else {
          if (0 < (int)uVar13) {
            uVar24 = 0;
            do {
              (&ptVar12->tv_sec)[uVar24] = pwVar3[uVar23 + uVar24] & Masks[lVar14][uVar24];
              uVar24 = uVar24 + 1;
            } while (uVar13 != uVar24);
            goto LAB_004b7093;
          }
LAB_004b7098:
          memset(&(&ts)[lVar14 * 4].tv_sec + (int)uVar13,0,(ulong)(7 - uVar13) * 8 + 8);
        }
        lVar14 = 1;
        ptVar12 = local_138;
        bVar26 = false;
      } while (bVar19);
      pAssump[local_1b0] = (uVar11 | (uint)local_1f0) ^ 1;
      memcpy(p->pDivWords[(long)local_1c0],p->pDivWords[local_1b0],(long)p->nDivWords << 3);
      iVar10 = 0;
      if (!bVar18) {
        iVar10 = local_200;
      }
      iVar10 = Sfm_DecPeformDec_rec
                         (p,*pTruth_00,*local_1e8,pAssump,nAssump + 1,(word (*) [8])&ts,
                          (int)local_1e0,iVar10 + (int)local_1d8);
      *local_218 = iVar10;
      if (iVar10 == -2) goto LAB_004b7877;
      uVar11 = 1;
      local_218 = &local_1fc;
      paiVar15 = Supp + 1;
      pTruth_00 = uTruth + 1;
      bVar26 = false;
    } while (bVar18);
    iVar9 = Sfm_DecCombineDec(p,uTruth[0],uTruth[1],Supp[0],Supp[1],local_200,local_1fc,pTruth,
                              (int *)local_1f8,iVar9);
  }
  return iVar9;
LAB_004b7b74:
  uVar24 = 1;
  bVar18 = !bVar26;
  bVar26 = false;
  if (bVar18) goto LAB_004b7b89;
  goto LAB_004b78a0;
}

Assistant:

int Sfm_DecPeformDec_rec( Sfm_Dec_t * p, word * pTruth, int * pSupp, int * pAssump, int nAssump, word Masks[2][SFM_SIM_WORDS], int fCofactor, int nSuppAdd )
{
    int nBTLimit = p->pPars->nBTLimit;
//    int fVerbose = p->pPars->fVeryVerbose;
    int c, i, d, iLit, status, Var = -1;
    word * pDivWords = p->pDivWords[nAssump];
    abctime clk;
    assert( nAssump <= SFM_SUPP_MAX );
    if ( p->pPars->fVeryVerbose )
    {
        printf( "\nObject %d\n", p->iTarget );
        printf( "Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ", p->nDivs, Vec_IntSize(&p->vObjGates), p->nMffc, MIO_NUMINV*p->AreaMffc );
        printf( "Pat0 = %d.  Pat1 = %d.    ", p->nPats[0], p->nPats[1] );
        printf( "\n" );
        if ( nAssump )
        {
            printf( "Cofactor: " );
            for ( i = 0; i < nAssump; i++ )
                printf( " %s%d", Abc_LitIsCompl(pAssump[i])? "!":"", Abc_Lit2Var(pAssump[i]) );
            printf( "\n" );
        }
    }
    // check constant
    for ( c = 0; c < 2; c++ )
    {
        if ( !Abc_TtIsConst0(Masks[c], p->nPatWords[c]) ) // there are some patterns
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            Abc_TtConst( pTruth, Abc_TtWordNum(p->pPars->nVarMax), c );
            if ( p->pPars->fVeryVerbose )
                printf( "Found constant %d.\n", c );
            return 0;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    if ( p->iUseThis != -1 )
    {
        Var = p->iUseThis;
        p->iUseThis = -1;
        goto cofactor;
    }

    // check implications
    Vec_IntClear( &p->vImpls[0] );
    Vec_IntClear( &p->vImpls[1] );
    for ( d = 0; d < p->nDivs; d++ )
    {
        int Impls[2] = {-1, -1};
        for ( c = 0; c < 2; c++ )
        {
            word * pPats = Sfm_DecDivPats( p, d, c );
            int fHas0s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 1 );
            int fHas1s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 0 );
            if ( fHas0s && fHas1s )
                continue;
            pAssump[nAssump]   = Abc_Var2Lit( p->iTarget, c );
            pAssump[nAssump+1] = Abc_Var2Lit( d, fHas1s ); // if there are 1s, check if 0 is SAT
            clk = Abc_Clock();
            if ( Abc_TtGetBit( pDivWords, 4*d+2*c+fHas1s ) )
            {
                p->nSatCallsUnsat--;
                status = l_False;
            }
            else
            {
                p->nSatCalls++;
                status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 2, nBTLimit, 0, 0, 0 );
            }
            if ( status == l_Undef )
            {
                p->nTimeOuts++;
                return -2;
            }
            if ( status == l_False )
            {
                p->nSatCallsUnsat++;
                p->timeSatUnsat += Abc_Clock() - clk;
                Impls[c] = Abc_LitNot(pAssump[nAssump+1]);
                Vec_IntPush( &p->vImpls[c], Abc_LitNot(pAssump[nAssump+1]) );
                Abc_TtSetBit( pDivWords, 4*d+2*c+fHas1s );
                continue;
            }
            assert( status == l_True );
            p->nSatCallsSat++;
            p->timeSatSat += Abc_Clock() - clk;
            if ( p->nPats[c] == 64*SFM_SIM_WORDS )
            {
                p->nSatCallsOver++;
                continue;//return -2;//continue;
            }
            // record this status
            for ( i = 0; i < p->nDivs; i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                    Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
            Abc_TtSetBit( Masks[c], p->nPats[c]++ );
        }
        if ( Impls[0] == -1 || Impls[1] == -1 )
            continue;
        if ( Impls[0] == Impls[1] )
        {
            Vec_IntPop( &p->vImpls[0] );
            Vec_IntPop( &p->vImpls[1] );
            continue;
        }
        assert( Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1]) );
        // found buffer/inverter
        Abc_TtUnit( pTruth, Abc_TtWordNum(p->pPars->nVarMax), Abc_LitIsCompl(Impls[0]) );
        pSupp[0] = Abc_Lit2Var(Impls[0]);
        if ( p->pPars->fVeryVerbose )
            printf( "Found variable %s%d.\n", Abc_LitIsCompl(Impls[0]) ? "!":"", pSupp[0] );
        return 1;        
    }
    if ( nSuppAdd > p->pPars->nVarMax - 2 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "The number of assumption is more than MFFC size.\n" );
        return -2;
    }
    // try using all implications at once
    if ( p->pPars->fUseAndOr )
    for ( c = 0; c < 2; c++ )
    {
        if ( Vec_IntSize(&p->vImpls[!c]) < 2 )
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        assert( Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10 );
        Vec_IntForEachEntry( &p->vImpls[!c], iLit, i )
            pAssump[nAssump+1+i] = iLit;
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump+1+i, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            int * pFinal, nFinal = sat_solver_final( p->pSat, &pFinal );
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            if ( nFinal + nSuppAdd > 6 )
                continue;
            // collect only relevant literals
            for ( i = d = 0; i < nFinal; i++ )
                if ( Vec_IntFind(&p->vImpls[!c], Abc_LitNot(pFinal[i])) >= 0 )
                    pSupp[d++] = Abc_LitNot(pFinal[i]);
            nFinal = d;
            // create AND/OR gate
            assert( nFinal <= 6 );
            if ( c )
            {
                *pTruth = ~(word)0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth &= Abc_LitIsCompl(pSupp[i]) ? ~s_Truths6[i] : s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            else
            {
                *pTruth = 0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth |= Abc_LitIsCompl(pSupp[i]) ? s_Truths6[i] : ~s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            Abc_TtStretch6( pTruth, nFinal, p->pPars->nVarMax );
            p->nNodesAndOr++;
            if ( p->pPars->fVeryVerbose )
                printf( "Found %d-input AND/OR gate.\n", nFinal );
            return nFinal;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    // find the best cofactoring variable
//    if ( !fCofactor || Vec_IntSize(&p->vImpls[0]) + Vec_IntSize(&p->vImpls[1]) > 2 )
    Var = Sfm_DecFindBestVar( p, Masks );
//    if ( Var == -1 )
//        Var = Sfm_DecFindBestVar2( p, Masks );

/*
    {
        int Lit0 = Vec_IntSize(&p->vImpls[0]) ? Vec_IntEntry(&p->vImpls[0], 0) : -1;
        int Lit1 = Vec_IntSize(&p->vImpls[1]) ? Vec_IntEntry(&p->vImpls[1], 0) : -1;
        if ( Lit0 == -1 && Lit1 >= 0 )
            Var = Abc_Lit2Var(Lit1);
        else if ( Lit1 == -1 && Lit0 >= 0 )
            Var = Abc_Lit2Var(Lit0);
        else if ( Lit0 >= 0 && Lit1 >= 0 )
        {
            if ( Lit0 < Lit1 )
                Var = Abc_Lit2Var(Lit0);
            else
                Var = Abc_Lit2Var(Lit1);
        }
    }
*/

    if ( Var == -1 && fCofactor )
    {
        //for ( Var = p->nDivs - 1; Var >= 0; Var-- )
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
            if ( Vec_IntFind(&p->vObjDec, Var) == -1 )
                break;
//        if ( i == Vec_IntSize(&p->vObjInMffc) )
        if ( i == -1 )
            Var = -1;
        fCofactor = 0;
    }

    if ( p->pPars->fVeryVerbose )
    {
        Sfm_DecPrint( p, Masks );
        printf( "Best var %d\n", Var );
        printf( "\n" );
    }
cofactor:
    // cofactor the problem
    if ( Var >= 0 )
    {
        word uTruth[2][SFM_WORD_MAX], MasksNext[2][SFM_SIM_WORDS];
        int w, Supp[2][2*SFM_SUPP_MAX], nSupp[2] = {0};
        Vec_IntPush( &p->vObjDec, Var );
        for ( i = 0; i < 2; i++ )
        {
            for ( c = 0; c < 2; c++ )
            {
                Abc_TtAndSharp( MasksNext[c], Masks[c], Sfm_DecDivPats(p, Var, c), p->nPatWords[c], !i );
                for ( w = p->nPatWords[c]; w < SFM_SIM_WORDS; w++ )
                    MasksNext[c][w] = 0;
            }
            pAssump[nAssump] = Abc_Var2Lit( Var, !i );
            memcpy( p->pDivWords[nAssump+1], p->pDivWords[nAssump], sizeof(word) * p->nDivWords );
            nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], Supp[i], pAssump, nAssump+1, MasksNext, fCofactor, (i ? nSupp[0] : 0) + nSuppAdd + 1 );
            if ( nSupp[i] == -2 )
                return -2;
        }
        // combine solutions
        return Sfm_DecCombineDec( p, uTruth[0], uTruth[1], Supp[0], Supp[1], nSupp[0], nSupp[1], pTruth, pSupp, Var );
    }
    return -2;
}